

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O3

Expression * __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AcosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AcosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AcosOp>_>
::createNextChild(UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AcosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AcosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AcosOp>_>
                  *this,GeneratorState *state)

{
  ConstValueRangeAccess valueRange;
  ConstValueRangeAccess CVar1;
  Scalar *pSVar2;
  ExpressionSpec *pEVar3;
  Expression *pEVar4;
  Scalar *pSVar5;
  
  if (this->m_child != (Expression *)0x0) {
    return (Expression *)0x0;
  }
  pSVar2 = (this->m_inValueRange).m_min.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar5 = (this->m_inValueRange).m_max.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar2 == (this->m_inValueRange).m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pSVar2 = (Scalar *)0x0;
  }
  if (pSVar5 == (this->m_inValueRange).m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pSVar5 = (Scalar *)0x0;
  }
  valueRange.m_min = pSVar2;
  valueRange.m_type = &(this->m_inValueRange).m_type;
  valueRange.m_max = pSVar5;
  pEVar3 = anon_unknown_0::chooseExpression
                     (state,(ExpressionSpec *)(anonymous_namespace)::s_expressionSpecs,0x1e,
                      valueRange);
  CVar1.m_min = pSVar2;
  CVar1.m_type = &(this->m_inValueRange).m_type;
  CVar1.m_max = pSVar5;
  pEVar4 = (*pEVar3->create)(state,CVar1);
  this->m_child = pEVar4;
  return pEVar4;
}

Assistant:

Expression* UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::createNextChild (GeneratorState& state)
{
	if (m_child)
		return DE_NULL;

	m_child = Expression::createRandom(state, m_inValueRange.asAccess());
	return m_child;
}